

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

obj * display_minventory(monst *mon,int dflags,char *title)

{
  obj *poVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  code *allow;
  object_pick *selected;
  char tmp [128];
  object_pick *local_b0;
  char local_a8 [136];
  
  local_b0 = (object_pick *)0x0;
  pcVar3 = noit_Monnam(mon);
  pcVar3 = s_suffix(pcVar3);
  pcVar4 = "possessions";
  if ((dflags & 2U) == 0) {
    pcVar4 = "armament";
  }
  sprintf(local_a8,"%s %s:",pcVar3,pcVar4);
  if ((dflags & 2U) == 0) {
    allow = worn_wield_only;
    if ((mon->misc_worn_check != 0) || (mon->mw != (obj *)0x0)) {
LAB_001b1fcc:
      youmonst.data = mon->data;
      pcVar3 = local_a8;
      if (title != (char *)0x0) {
        pcVar3 = title;
      }
      iVar2 = query_objlist(pcVar3,mon->minvent,8,&local_b0,~dflags & 1,allow);
      set_uasmon();
      if (iVar2 < 1) {
        return (obj *)0x0;
      }
      poVar1 = local_b0->obj;
      free(local_b0);
      return poVar1;
    }
  }
  else if (mon->minvent != (obj *)0x0) {
    allow = allow_all;
    goto LAB_001b1fcc;
  }
  pcVar3 = local_a8;
  if (title != (char *)0x0) {
    pcVar3 = title;
  }
  invdisp_nothing(pcVar3,"(none)");
  return (obj *)0x0;
}

Assistant:

struct obj *display_minventory(struct monst *mon, int dflags, char *title)
{
	struct obj *ret;
	char tmp[QBUFSZ];
	int n;
	struct object_pick *selected = NULL;
	int do_all = (dflags & MINV_ALL) != 0;

	sprintf(tmp,"%s %s:", s_suffix(noit_Monnam(mon)),
		do_all ? "possessions" : "armament");

	if (do_all ? (mon->minvent != 0)
		   : (mon->misc_worn_check || MON_WEP(mon))) {
	    /* Fool the 'weapon in hand' routine into
	     * displaying 'weapon in claw', etc. properly.
	     */
	    youmonst.data = mon->data;

	    n = query_objlist(title ? title : tmp, mon->minvent, INVORDER_SORT, &selected,
			(dflags & MINV_NOLET) ? PICK_NONE : PICK_ONE,
			do_all ? allow_all : worn_wield_only);

	    set_uasmon();
	} else {
	    invdisp_nothing(title ? title : tmp, "(none)");
	    n = 0;
	}

	if (n > 0) {
	    ret = selected[0].obj;
	    free(selected);
	} else
	    ret = NULL;
	return ret;
}